

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O0

void __thiscall
ByteData_BytesConstructor_Test::~ByteData_BytesConstructor_Test
          (ByteData_BytesConstructor_Test *this)

{
  ByteData_BytesConstructor_Test *this_local;
  
  ~ByteData_BytesConstructor_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ByteData, BytesConstructor) {
  std::vector<uint8_t> target(20);
  uint8_t byte = 1;
  for (size_t i = 0; i < target.size(); i++) {
    target[i] = byte;
    byte++;
    if (byte > 9) {
      byte = 0;
    }
  }
  ByteData byte_data = ByteData(target);
  bool is_equals = (byte_data.GetBytes() == target);

  EXPECT_STREQ(byte_data.GetHex().c_str(),
               "0102030405060708090001020304050607080900");
  EXPECT_TRUE(is_equals);
  EXPECT_EQ(byte_data.GetDataSize(), target.size());
  EXPECT_FALSE(byte_data.IsEmpty());
  EXPECT_STREQ(
    byte_data.Serialize().GetHex().c_str(),
    "140102030405060708090001020304050607080900");
}